

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O2

uLong crc32_z(unsigned_long crc,uchar *buf,z_size_t len)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  ulong uVar4;
  
  if (buf == (uchar *)0x0) {
    return 0;
  }
  uVar2 = ~(uint)crc;
  for (puVar3 = buf; (len != 0 && (((ulong)puVar3 & 3) != 0)); puVar3 = puVar3 + 1) {
    uVar1 = *(uint *)buf;
    buf = (uchar *)((long)buf + 1);
    uVar2 = uVar2 >> 8 ^ crc_table[0][(byte)((byte)uVar1 ^ (byte)uVar2)];
    len = len - 1;
  }
  for (; 0x1f < len; len = len - 0x20) {
    uVar2 = uVar2 ^ *(uint *)buf;
    uVar2 = crc_table[2][uVar2 >> 8 & 0xff] ^ crc_table[3][uVar2 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar2 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar2 >> 0x18] ^ *(uint *)((long)buf + 4);
    uVar2 = crc_table[2][uVar2 >> 8 & 0xff] ^ crc_table[3][uVar2 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar2 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar2 >> 0x18] ^ *(uint *)((long)buf + 8);
    uVar2 = crc_table[2][uVar2 >> 8 & 0xff] ^ crc_table[3][uVar2 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar2 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar2 >> 0x18] ^ *(uint *)((long)buf + 0xc);
    uVar2 = crc_table[2][uVar2 >> 8 & 0xff] ^ crc_table[3][uVar2 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar2 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar2 >> 0x18] ^ *(uint *)((long)buf + 0x10);
    uVar2 = crc_table[2][uVar2 >> 8 & 0xff] ^ crc_table[3][uVar2 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar2 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar2 >> 0x18] ^ *(uint *)((long)buf + 0x14);
    uVar2 = crc_table[2][uVar2 >> 8 & 0xff] ^ crc_table[3][uVar2 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar2 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar2 >> 0x18] ^ *(uint *)((long)buf + 0x18);
    uVar2 = crc_table[2][uVar2 >> 8 & 0xff] ^ crc_table[3][uVar2 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar2 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar2 >> 0x18] ^ *(uint *)((long)buf + 0x1c);
    buf = (uchar *)((long)buf + 0x20);
    uVar2 = crc_table[2][uVar2 >> 8 & 0xff] ^ crc_table[3][uVar2 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar2 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar2 >> 0x18];
  }
  for (; 3 < len; len = len - 4) {
    uVar2 = uVar2 ^ *(uint *)buf;
    buf = (uchar *)((long)buf + 4);
    uVar2 = crc_table[2][uVar2 >> 8 & 0xff] ^ crc_table[3][uVar2 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar2 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar2 >> 0x18];
  }
  if (len != 0) {
    uVar4 = 0;
    do {
      uVar2 = uVar2 >> 8 ^ crc_table[0][(byte)(*(byte *)((long)buf + uVar4) ^ (byte)uVar2)];
      uVar4 = uVar4 + 1;
    } while (len != uVar4);
  }
  return (ulong)~uVar2;
}

Assistant:

unsigned long ZEXPORT crc32_z(crc, buf, len)
    unsigned long crc;
    const unsigned char FAR *buf;
    z_size_t len;
{
    if (buf == Z_NULL) return 0UL;

#ifdef DYNAMIC_CRC_TABLE
    if (crc_table_empty)
        make_crc_table();
#endif /* DYNAMIC_CRC_TABLE */

#ifdef BYFOUR
    if (sizeof(void *) == sizeof(ptrdiff_t)) {
        z_crc_t endian;

        endian = 1;
        if (*((unsigned char *)(&endian)))
            return crc32_little(crc, buf, len);
        else
            return crc32_big(crc, buf, len);
    }
#endif /* BYFOUR */
    crc = crc ^ 0xffffffffUL;
    while (len >= 8) {
        DO8;
        len -= 8;
    }
    if (len) do {
        DO1;
    } while (--len);
    return crc ^ 0xffffffffUL;
}